

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Triangle::clock_linear_counter(Nes_Triangle *this)

{
  Nes_Triangle *this_local;
  
  if (((this->super_Nes_Osc).reg_written[3] & 1U) == 0) {
    if (this->linear_counter != 0) {
      this->linear_counter = this->linear_counter + -1;
    }
  }
  else {
    this->linear_counter = (this->super_Nes_Osc).regs[0] & 0x7f;
  }
  if (((this->super_Nes_Osc).regs[0] & 0x80) == 0) {
    (this->super_Nes_Osc).reg_written[3] = false;
  }
  return;
}

Assistant:

void Nes_Triangle::clock_linear_counter()
{
	if ( reg_written [3] )
		linear_counter = regs [0] & 0x7F;
	else if ( linear_counter )
		linear_counter--;
	
	if ( !(regs [0] & 0x80) )
		reg_written [3] = false;
}